

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

bool __thiscall jwt::payload::has_not_before(payload *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"nbf",&local_31);
  bVar1 = has_payload_claim(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool has_not_before() const noexcept { return has_payload_claim("nbf"); }